

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

bool __thiscall
ON_DimStyle::Internal_SetIdMember
          (ON_DimStyle *this,field field_id,ON_UUID value,ON_UUID *class_member)

{
  bool bVar1;
  ON_UUID_struct local_30;
  
  local_30.Data4 = value.Data4;
  local_30._0_8_ = value._0_8_;
  bVar1 = ::operator!=(&local_30,class_member);
  if (bVar1) {
    class_member->Data1 = local_30.Data1;
    class_member->Data2 = local_30.Data2;
    class_member->Data3 = local_30.Data3;
    *&class_member->Data4 = local_30.Data4;
    Internal_ContentChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return bVar1;
}

Assistant:

bool ON_DimStyle::Internal_SetIdMember(
  ON_DimStyle::field field_id,
  ON_UUID value,
  ON_UUID& class_member
)
{
  bool bValueChanged = false;
  if (value != class_member)
  {
    class_member = value;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}